

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsplitscb(bstring str,bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,void *parm)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  charField chrs;
  charField local_70;
  
  uVar1 = 0xffffffff;
  if ((((-1 < pos) && (str != (bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     ((uVar4 = str->slen, splitStr != (bstring)0x0 && pos <= (int)uVar4 &&
      (iVar2 = splitStr->slen, -1 < iVar2)))) {
    if (iVar2 == 1) {
      iVar2 = bsplitcb(str,*splitStr->data,pos,cb,parm);
      return iVar2;
    }
    if (iVar2 == 0) {
      uVar1 = (*cb)(parm,0,uVar4);
      uVar1 = uVar1 & (int)uVar1 >> 0x1f;
    }
    else {
      buildCharField(&local_70,splitStr);
      do {
        uVar5 = pos;
        if (pos < (int)uVar4) {
          pbVar3 = str->data + (uint)pos;
          uVar1 = pos;
          do {
            uVar5 = uVar1;
            if (((uint)local_70.content[*pbVar3 >> 5] >> (*pbVar3 & 0x1f) & 1) != 0) break;
            uVar1 = uVar1 + 1;
            pbVar3 = pbVar3 + 1;
            uVar5 = uVar4;
          } while ((int)uVar1 < (int)uVar4);
        }
        iVar2 = (*cb)(parm,pos,uVar5 - pos);
        if (iVar2 < 0) {
          return iVar2;
        }
        pos = uVar5 + 1;
        uVar4 = str->slen;
        uVar1 = 0;
      } while ((int)uVar5 < (int)uVar4);
    }
  }
  return uVar1;
}

Assistant:

int bsplitscb (const bstring str, const bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
struct charField chrs;
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen 
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;
	if (splitStr->slen == 0) {
		if ((ret = cb (parm, 0, str->slen)) > 0) ret = 0;
		return ret;
	}

	if (splitStr->slen == 1) 
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	buildCharField (&chrs, splitStr);

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (testInCharField (&chrs, str->data[i])) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return 0;
}